

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,_-1L>)>::Action
          (Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this,
          ActionInterface<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *impl
          )

{
  ActionAdapter local_28;
  ActionInterface<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *local_18;
  ActionInterface<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *impl_local;
  Action<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)> *this_local;
  
  local_18 = impl;
  impl_local = (ActionInterface<pstore::serialize::archive::void_type_(pstore::gsl::span<int,__1L>)>
                *)this;
  std::
  shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(pstore::gsl::span<int,-1l>)>>
  ::
  shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>,void>
            ((shared_ptr<testing::ActionInterface<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>>
              *)&local_28,impl);
  std::function<pstore::serialize::archive::void_type(pstore::gsl::span<int,-1l>)>::
  function<testing::Action<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)>::ActionAdapter,void>
            ((function<pstore::serialize::archive::void_type(pstore::gsl::span<int,_1l>)> *)this,
             &local_28);
  ActionAdapter::~ActionAdapter(&local_28);
  return;
}

Assistant:

explicit Action(ActionInterface<F>* impl)
      : fun_(ActionAdapter{::std::shared_ptr<ActionInterface<F>>(impl)}) {}